

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  bool bVar3;
  mode_t permissions_00;
  int iVar4;
  Status SVar5;
  ostream *poVar6;
  char *pcVar7;
  mode_t permissions_01;
  unsigned_long dindex;
  Directory dir;
  mode_t permissions;
  cmAlphaNum local_240;
  string *local_210;
  unsigned_long local_208;
  char *local_200;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  string toPath;
  string fromPath;
  ostringstream e;
  
  bVar2 = cmsys::SystemTools::FileIsDirectory(destination);
  bVar3 = true;
  if (bVar2) {
    bVar3 = cmsys::SystemTools::FileIsSymlink(destination);
  }
  (*this->_vptr_cmFileCopier[5])(this,destination,1,(ulong)bVar3);
  default_dir_mode = &default_dir_mode_v;
  default_dir_mode_v = 0;
  bVar2 = GetDefaultDirectoryPermissions(this,&default_dir_mode);
  if (bVar2) {
    SVar5 = cmsys::SystemTools::MakeDirectory(destination,default_dir_mode);
    if (SVar5.Kind_ == Success) {
      permissions = match_properties.Permissions;
      if ((ulong)match_properties >> 0x20 == 0) {
        permissions = this->DirPermissions;
      }
      if (permissions == 0) {
        cmsys::SystemTools::GetPermissions(source,&permissions);
      }
      permissions_01 = permissions | 0x1c0;
      permissions_00 = permissions;
      if ((~permissions & 0x1c0) == 0) {
        permissions_00 = 0;
        permissions_01 = permissions;
      }
      bVar2 = SetPermissions(this,destination,permissions_01);
      if (bVar2) {
        cmsys::Directory::Directory(&dir);
        if (source->_M_string_length != 0) {
          cmsys::Directory::Load(&dir,source,(string *)0x0);
        }
        local_210 = source;
        local_208 = cmsys::Directory::GetNumberOfFiles(&dir);
        dindex = 0;
        do {
          if (local_208 == dindex) {
            bVar2 = SetPermissions(this,destination,permissions_00);
LAB_00327655:
            cmsys::Directory::~Directory(&dir);
            return bVar2;
          }
          pcVar7 = cmsys::Directory::GetFile(&dir,dindex);
          if (((*pcVar7 != '.') || (pcVar7[1] != '\0')) &&
             ((pcVar7 = cmsys::Directory::GetFile(&dir,dindex), *pcVar7 != '.' ||
              ((pcVar7[1] != '.' || (pcVar7[2] != '\0')))))) {
            _e = local_210->_M_string_length;
            local_240.View_._M_len = 1;
            local_240.Digits_[0] = '/';
            local_240.View_._M_str = local_240.Digits_;
            toPath._M_dataplus._M_p = cmsys::Directory::GetFile(&dir,dindex);
            cmStrCat<char_const*>(&fromPath,(cmAlphaNum *)&e,&local_240,(char **)&toPath);
            _e = destination->_M_string_length;
            local_240.View_._M_len = 1;
            local_240.Digits_[0] = '/';
            local_240.View_._M_str = local_240.Digits_;
            local_200 = cmsys::Directory::GetFile(&dir,dindex);
            cmStrCat<char_const*>(&toPath,(cmAlphaNum *)&e,&local_240,&local_200);
            iVar4 = (*this->_vptr_cmFileCopier[3])(this,&fromPath,&toPath);
            std::__cxx11::string::~string((string *)&toPath);
            std::__cxx11::string::~string((string *)&fromPath);
            if ((char)iVar4 == '\0') {
              bVar2 = false;
              goto LAB_00327655;
            }
          }
          dindex = dindex + 1;
        } while( true );
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,this->Name);
      poVar6 = std::operator<<(poVar6," cannot make directory \"");
      poVar6 = std::operator<<(poVar6,(string *)destination);
      poVar6 = std::operator<<(poVar6,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      poVar6 = std::operator<<(poVar6,(string *)&local_240);
      std::operator<<(poVar6,".");
      std::__cxx11::string::~string((string *)&local_240);
      pcVar1 = this->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}